

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               size_t source_length)

{
  ulong uVar1;
  ulong uVar2;
  xml_allocator *this;
  char **ppcVar3;
  size_t sVar4;
  undefined2 *puVar5;
  undefined2 uVar6;
  ulong size;
  ulong uVar7;
  char *__dest;
  bool bVar8;
  xml_memory_page *local_48;
  ulong local_40;
  char **local_38;
  
  if (source_length == 0) {
    if ((*header & header_mask) != 0) {
      anon_unknown_0::xml_allocator::deallocate_string
                (*(xml_allocator **)((long)header - (*header >> 8)),(char_t *)*dest);
    }
    *dest = (char *)0x0;
    *header = *header & ~header_mask;
    return true;
  }
  if (((char_t *)*dest == (char_t *)0x0) || ((*header & 0x40) != 0)) {
LAB_00104ef9:
    this = *(xml_allocator **)((long)header - (*header >> 8));
    uVar2 = source_length + 0xc;
    size = uVar2 & 0xfffffffffffffff8;
    uVar1 = this->_busy_size + size;
    local_40 = header_mask;
    local_38 = dest;
    if (uVar1 < 0x7fd9) {
      local_48 = this->_root;
      puVar5 = (undefined2 *)((long)&local_48[1].allocator + this->_busy_size);
      this->_busy_size = uVar1;
    }
    else {
      puVar5 = (undefined2 *)anon_unknown_0::xml_allocator::allocate_memory_oob(this,size,&local_48)
      ;
    }
    ppcVar3 = local_38;
    uVar1 = local_40;
    if (puVar5 == (undefined2 *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      if (((long)puVar5 - (long)local_48 & 7U) != 0) {
        __assert_fail("page_offset % xml_memory_block_alignment == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x291,
                      "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                     );
      }
      uVar7 = ((long)puVar5 - (long)local_48) - 0x28;
      if (0x7ffff < uVar7) {
        __assert_fail("page_offset >= 0 && static_cast<size_t>(page_offset) < max_encoded_offset",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x292,
                      "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                     );
      }
      *puVar5 = (short)(uVar7 >> 3);
      if ((0x7ffff < uVar2) && ((uVar7 != 0 || (local_48->busy_size != size)))) {
        __assert_fail("full_size < max_encoded_offset || (page->busy_size == full_size && page_offset == 0)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x297,
                      "char_t *pugi::impl::(anonymous namespace)::xml_allocator::allocate_string(size_t)"
                     );
      }
      uVar6 = 0;
      if (uVar2 < 0x80000) {
        uVar6 = (short)(uVar2 >> 3);
      }
      puVar5[1] = uVar6;
      __dest = (char *)(puVar5 + 2);
    }
    if (__dest == (char *)0x0) {
      return __dest != (char *)0x0;
    }
    memcpy(__dest,source,source_length);
    __dest[source_length] = '\0';
    if ((*header & uVar1) != 0) {
      anon_unknown_0::xml_allocator::deallocate_string(this,(char_t *)*ppcVar3);
    }
    *ppcVar3 = __dest;
    *header = *header | uVar1;
  }
  else {
    sVar4 = anon_unknown_0::strlength((char_t *)*dest);
    if ((*header & header_mask) == 0) {
      bVar8 = source_length <= sVar4;
LAB_00104eda:
      if (!bVar8) goto LAB_00104ef9;
    }
    else {
      if (sVar4 < source_length) goto LAB_00104ef9;
      if (0x1f < sVar4) {
        bVar8 = sVar4 - source_length < sVar4 >> 1;
        goto LAB_00104eda;
      }
    }
    memcpy(*dest,source,source_length);
    (*dest)[source_length] = '\0';
  }
  return true;
}

Assistant:

PUGI__FN bool strcpy_insitu(String& dest, Header& header, uintptr_t header_mask, const char_t* source, size_t source_length)
	{
		if (source_length == 0)
		{
			// empty string and null pointer are equivalent, so just deallocate old memory
			xml_allocator* alloc = PUGI__GETPAGE_IMPL(header)->allocator;

			if (header & header_mask) alloc->deallocate_string(dest);

			// mark the string as not allocated
			dest = 0;
			header &= ~header_mask;

			return true;
		}
		else if (dest && strcpy_insitu_allow(source_length, header, header_mask, dest))
		{
			// we can reuse old buffer, so just copy the new data (including zero terminator)
			memcpy(dest, source, source_length * sizeof(char_t));
			dest[source_length] = 0;

			return true;
		}
		else
		{
			xml_allocator* alloc = PUGI__GETPAGE_IMPL(header)->allocator;

			if (!alloc->reserve()) return false;

			// allocate new buffer
			char_t* buf = alloc->allocate_string(source_length + 1);
			if (!buf) return false;

			// copy the string (including zero terminator)
			memcpy(buf, source, source_length * sizeof(char_t));
			buf[source_length] = 0;

			// deallocate old buffer (*after* the above to protect against overlapping memory and/or allocation failures)
			if (header & header_mask) alloc->deallocate_string(dest);

			// the string is now allocated, so set the flag
			dest = buf;
			header |= header_mask;

			return true;
		}
	}